

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O0

void __thiscall QJsonDocument::setObject(QJsonDocument *this,QJsonObject *object)

{
  bool bVar1;
  QJsonValue *in_RSI;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
  *in_stack_ffffffffffffff98;
  unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
  *in_stack_ffffffffffffffa0;
  QCborValue *other;
  QCborValue local_38 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *
                     )0x1af7cf);
  if (!bVar1) {
    std::make_unique<QJsonDocumentPrivate>();
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator=
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::~unique_ptr
              (in_stack_ffffffffffffffa0);
  }
  other = local_38;
  QJsonValue::QJsonValue(in_RSI,(QJsonObject *)in_RDI);
  QCborValue::fromJsonValue((QJsonValue *)in_RDI);
  std::unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>::operator->
            ((unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_> *)
             0x1af827);
  QCborValue::operator=(in_RDI,other);
  QCborValue::~QCborValue(other);
  QJsonValue::~QJsonValue((QJsonValue *)0x1af846);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QJsonDocument::setObject(const QJsonObject &object)
{
    if (!d)
        d = std::make_unique<QJsonDocumentPrivate>();

    d->value = QCborValue::fromJsonValue(object);
}